

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scan.hpp
# Opt level: O2

int * Omega_h::inclusive_scan<Omega_h::CastIterator<int,signed_char>,int*>
                (CastIterator<int,_signed_char> first,CastIterator<int,_signed_char> last,
                int *result)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)last.ptr - (long)first.ptr;
  if (0 < lVar3) {
    iVar1 = (int)*first.ptr;
    *result = iVar1;
    for (lVar2 = 1; lVar2 < lVar3; lVar2 = lVar2 + 1) {
      iVar1 = iVar1 + first.ptr[lVar2];
      result[lVar2] = iVar1;
    }
    result = result + lVar3;
  }
  return result;
}

Assistant:

OutputIterator inclusive_scan(
    InputIterator first, InputIterator last, OutputIterator result) {
  auto const n = last - first;
  if (n <= 0) return result;
  auto value = first[0];
  result[0] = value;
  using d_t = typename std::remove_const<decltype(n)>::type;
  for (d_t i = 1; i < n; ++i) {
    value = std::move(value) + first[i];
    result[i] = value;
  }
  return result + n;
}